

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_mqtt_common.c
# Opt level: O0

MQTT_CLIENT_ACK_OPTION mqttNotificationCallback(MQTT_MESSAGE_HANDLE msgHandle,void *callbackCtx)

{
  int iVar1;
  char *topicName_00;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  char *topicName;
  PMQTTTRANSPORT_HANDLE_DATA pMStack_20;
  IOTHUB_IDENTITY_TYPE type;
  PMQTTTRANSPORT_HANDLE_DATA transportData;
  void *callbackCtx_local;
  MQTT_MESSAGE_HANDLE msgHandle_local;
  
  if ((msgHandle != (MQTT_MESSAGE_HANDLE)0x0) && (callbackCtx != (void *)0x0)) {
    pMStack_20 = (PMQTTTRANSPORT_HANDLE_DATA)callbackCtx;
    transportData = (PMQTTTRANSPORT_HANDLE_DATA)callbackCtx;
    callbackCtx_local = msgHandle;
    topicName_00 = mqttmessage_getTopicName(msgHandle);
    if (topicName_00 == (char *)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                  ,"mqttNotificationCallback",0x7f8,1,"Failure: NULL topic name encountered");
      }
    }
    else {
      iVar1 = retrieveTopicType(pMStack_20,topicName_00,
                                (IOTHUB_IDENTITY_TYPE *)((long)&topicName + 4));
      if (iVar1 == 0) {
        if (topicName._4_4_ == IOTHUB_TYPE_DEVICE_TWIN) {
          processTwinNotification(pMStack_20,(MQTT_MESSAGE_HANDLE)callbackCtx_local,topicName_00);
        }
        else if (topicName._4_4_ == IOTHUB_TYPE_DEVICE_METHODS) {
          processDeviceMethodNotification
                    (pMStack_20,(MQTT_MESSAGE_HANDLE)callbackCtx_local,topicName_00);
        }
        else {
          processIncomingMessageNotification
                    (pMStack_20,(MQTT_MESSAGE_HANDLE)callbackCtx_local,topicName_00,topicName._4_4_)
          ;
        }
      }
      else {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                    ,"mqttNotificationCallback",0x7fc,1,
                    "Received unexpected topic.  Ignoring remainder of request");
        }
      }
    }
  }
  return MQTT_CLIENT_ACK_NONE;
}

Assistant:

static MQTT_CLIENT_ACK_OPTION mqttNotificationCallback(MQTT_MESSAGE_HANDLE msgHandle, void* callbackCtx)
{
    if (msgHandle != NULL && callbackCtx != NULL)
    {
        PMQTTTRANSPORT_HANDLE_DATA transportData = (PMQTTTRANSPORT_HANDLE_DATA)callbackCtx;
        IOTHUB_IDENTITY_TYPE type;

        const char* topicName = mqttmessage_getTopicName(msgHandle);
        if (topicName == NULL)
        {
            LogError("Failure: NULL topic name encountered");
        }
        else if (retrieveTopicType(transportData, topicName, &type) != 0)
        {
            LogError("Received unexpected topic.  Ignoring remainder of request");
        }
        else
        {
            if (type == IOTHUB_TYPE_DEVICE_TWIN)
            {
                processTwinNotification(transportData, msgHandle, topicName);
            }
            else if (type == IOTHUB_TYPE_DEVICE_METHODS)
            {
                processDeviceMethodNotification(transportData, msgHandle, topicName);
            }
            else
            {
                processIncomingMessageNotification(transportData, msgHandle, topicName, type);
            }
        }
    }

    return MQTT_CLIENT_ACK_NONE;
}